

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.hpp
# Opt level: O3

string * __thiscall
ws::time_to_str_abi_cxx11_(string *__return_storage_ptr__,ws *this,time_point *now)

{
  tm *ptVar1;
  size_t sVar2;
  time_t tt;
  char date [60];
  
  tt = *(long *)this / 1000000000;
  ptVar1 = localtime(&tt);
  date[0x30] = '\0';
  date[0x31] = '\0';
  date[0x32] = '\0';
  date[0x33] = '\0';
  date[0x34] = '\0';
  date[0x35] = '\0';
  date[0x36] = '\0';
  date[0x37] = '\0';
  date[0x38] = '\0';
  date[0x39] = '\0';
  date[0x3a] = '\0';
  date[0x3b] = '\0';
  date[0x20] = '\0';
  date[0x21] = '\0';
  date[0x22] = '\0';
  date[0x23] = '\0';
  date[0x24] = '\0';
  date[0x25] = '\0';
  date[0x26] = '\0';
  date[0x27] = '\0';
  date[0x28] = '\0';
  date[0x29] = '\0';
  date[0x2a] = '\0';
  date[0x2b] = '\0';
  date[0x2c] = '\0';
  date[0x2d] = '\0';
  date[0x2e] = '\0';
  date[0x2f] = '\0';
  date[0x10] = '\0';
  date[0x11] = '\0';
  date[0x12] = '\0';
  date[0x13] = '\0';
  date[0x14] = '\0';
  date[0x15] = '\0';
  date[0x16] = '\0';
  date[0x17] = '\0';
  date[0x18] = '\0';
  date[0x19] = '\0';
  date[0x1a] = '\0';
  date[0x1b] = '\0';
  date[0x1c] = '\0';
  date[0x1d] = '\0';
  date[0x1e] = '\0';
  date[0x1f] = '\0';
  date[0] = '\0';
  date[1] = '\0';
  date[2] = '\0';
  date[3] = '\0';
  date[4] = '\0';
  date[5] = '\0';
  date[6] = '\0';
  date[7] = '\0';
  date[8] = '\0';
  date[9] = '\0';
  date[10] = '\0';
  date[0xb] = '\0';
  date[0xc] = '\0';
  date[0xd] = '\0';
  date[0xe] = '\0';
  date[0xf] = '\0';
  sprintf(date,"%d-%02d-%02d %02d:%02d:%02d",(ulong)(ptVar1->tm_year + 0x76c),
          (ulong)(ptVar1->tm_mon + 1),(ulong)(uint)ptVar1->tm_mday,(ulong)(uint)ptVar1->tm_hour,
          (ulong)(uint)ptVar1->tm_min,(ulong)(uint)ptVar1->tm_sec);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(date);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,date,date + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string time_to_str(const std::chrono::system_clock::time_point &now)
  {
    auto tt = std::chrono::system_clock::to_time_t(now);
    struct tm *ptm = localtime(&tt);
    char date[60] = {0};
    sprintf(date, "%d-%02d-%02d %02d:%02d:%02d",
            (int) ptm->tm_year + 1900, (int) ptm->tm_mon + 1, (int) ptm->tm_mday,
            (int) ptm->tm_hour, (int) ptm->tm_min, (int) ptm->tm_sec);
    return {date};
  }